

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::String> * __thiscall
kj::anon_unknown_9::DiskHandle::tryReadlink
          (Maybe<kj::String> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  int __fd;
  char *pcVar1;
  char *__buf;
  size_t sVar2;
  ulong uVar3;
  int *piVar4;
  ArrayPtr<char> AVar5;
  String local_1d8;
  Fault local_1b8;
  Fault f;
  int local_1a8;
  undefined1 local_1a0 [4];
  int error;
  ulong local_188;
  ssize_t n;
  undefined1 local_170 [8];
  ArrayPtr<char> buf;
  Array<char> buf_heap;
  char buf_stack [256];
  bool buf_isOnStack;
  size_t buf_size;
  size_t trySize;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (DiskHandle *)path.parts.ptr;
  buf_size = 0x100;
  path_local.parts.size_ = (size_t)__return_storage_ptr__;
  do {
    if (buf_size < 0x101) {
      Array<char>::Array((Array<char> *)&buf.size_,(void *)0x0);
      AVar5 = arrayPtr<char>((char *)&buf_heap.disposer,buf_size);
    }
    else {
      heapArray<char>((Array<char> *)&buf.size_,buf_size);
      AVar5 = kj::Array::operator_cast_to_ArrayPtr((Array *)&buf.size_);
    }
    buf.ptr = (char *)AVar5.size_;
    local_170 = (undefined1  [8])AVar5.ptr;
    __fd = OwnFd::operator_cast_to_int(&this->fd);
    PathPtr::toString((String *)local_1a0,(PathPtr *)&this_local,false);
    pcVar1 = String::cStr((String *)local_1a0);
    __buf = ArrayPtr<char>::begin((ArrayPtr<char> *)local_170);
    sVar2 = ArrayPtr<char>::size((ArrayPtr<char> *)local_170);
    uVar3 = readlinkat(__fd,pcVar1,__buf,sVar2);
    String::~String((String *)local_1a0);
    local_188 = uVar3;
    if ((long)uVar3 < 0) {
      piVar4 = __errno_location();
      switch(*piVar4) {
      case 2:
      case 0x14:
      case 0x16:
        Maybe<kj::String>::Maybe(__return_storage_ptr__);
        local_1a8 = 1;
        break;
      default:
        _::Debug::Fault::Fault<int,kj::PathPtr&>
                  (&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x33a,*piVar4,"readlinkat(fd, path)","path",(PathPtr *)&this_local);
        Maybe<kj::String>::Maybe(__return_storage_ptr__);
        local_1a8 = 1;
        _::Debug::Fault::~Fault(&local_1b8);
        break;
      case 4:
        local_1a8 = 3;
      }
    }
    else {
      sVar2 = ArrayPtr<char>::size((ArrayPtr<char> *)local_170);
      if (uVar3 < sVar2) {
        pcVar1 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_170);
        heapString(&local_1d8,pcVar1,local_188);
        Maybe<kj::String>::Maybe(__return_storage_ptr__,&local_1d8);
        String::~String(&local_1d8);
        local_1a8 = 1;
      }
      else {
        buf_size = buf_size << 1;
        local_1a8 = 3;
      }
    }
    Array<char>::~Array((Array<char> *)&buf.size_);
  } while (local_1a8 != 1);
  return __return_storage_ptr__;
}

Assistant:

Maybe<String> tryReadlink(PathPtr path) const {
    size_t trySize = 256;
    for (;;) {
      KJ_STACK_ARRAY(char, buf, trySize, 256, 4096);
      ssize_t n = readlinkat(fd, path.toString().cStr(), buf.begin(), buf.size());
      if (n < 0) {
        int error = errno;
        switch (error) {
          case EINTR:
            continue;
          case ENOENT:
          case ENOTDIR:
          case EINVAL:    // not a link
            return kj::none;
          default:
            KJ_FAIL_SYSCALL("readlinkat(fd, path)", error, path) { return kj::none; }
        }
      }

      if (n >= buf.size()) {
        // Didn't give it enough space. Better retry with a bigger buffer.
        trySize *= 2;
        continue;
      }

      return heapString(buf.begin(), n);
    }
  }